

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mml.c
# Opt level: O1

int mml_calc_duration(uint len)

{
  uint uVar1;
  uint uVar2;
  
  snd_ticks_h = (uint)(0xc00000 / (ulong)len >> 8);
  uVar1 = (uint)(0xc00000 / (ulong)len);
  if (snd_timebase == '\0') {
    uVar1 = uVar1 & 0xff;
    uVar2 = 0xff;
  }
  else {
    uVar1 = uVar1 * (0x100 - snd_tempo) * 0x1e0;
    snd_ticks_h = uVar1 >> 0x18;
    uVar1 = uVar1 & 0xffffe0;
    uVar2 = 0xffffff;
  }
  snd_ticks_l = uVar1 + snd_ticks_l;
  if (uVar2 < snd_ticks_l) {
    snd_ticks_l = uVar2 & snd_ticks_l;
    snd_ticks_h = snd_ticks_h + 1;
  }
  if (snd_ticks_h == 0) {
    snd_ticks_h = 1;
  }
  return snd_ticks_h - 1;
}

Assistant:

int
mml_calc_duration(unsigned int len)
{
	unsigned int ticks, mask, tmp;

	/* ticks */
	ticks = 0xC00000 / len;

	/* base */
	if (snd_timebase == 0) {
		/* timer */
		mask = 0xFF;
		snd_ticks_h = (ticks >> 8);
		snd_ticks_l = (ticks & 0xFF) + snd_ticks_l;
	}
	else {
		/* fixed frequency (ie. vsync) */
		mask = 0xFFFFFF;
		tmp  = (256 - snd_tempo) * snd_timebase * ticks * 8;
		snd_ticks_h = (tmp >> 24);
		snd_ticks_l = (tmp & 0xFFFFFF) + snd_ticks_l;
	}

	/* adjust timings */
	if (snd_ticks_l  > mask) {
		snd_ticks_l &= mask;
		snd_ticks_h++;
	}
	if (snd_ticks_h == 0)
		snd_ticks_h = 1;

	/* result */
	return (snd_ticks_h - 1);
}